

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O0

void nn_stcp_start(nn_stcp *self,nn_usock *usock)

{
  nn_usock *in_RSI;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  bool bVar1;
  
  bVar1 = false;
  if (*(long *)(in_RDI + 0x60) == 0) {
    bVar1 = *(long *)(in_RDI + 0x208) == 0;
  }
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "self->usock == NULL && self->usock_owner.fsm == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x6a);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined4 *)(in_RDI + 0x200) = 1;
  *(long *)(in_RDI + 0x208) = in_RDI;
  nn_usock_swap_owner(in_RSI,(nn_fsm_owner *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  *(nn_usock **)(in_RDI + 0x60) = in_RSI;
  nn_fsm_start((nn_fsm *)0x30bc6c);
  return;
}

Assistant:

void nn_stcp_start (struct nn_stcp *self, struct nn_usock *usock)
{
    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_STCP_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}